

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

PartitionedSubscripts * __thiscall
spvtools::opt::LoopDependenceAnalysis::PartitionSubscripts
          (PartitionedSubscripts *__return_storage_ptr__,LoopDependenceAnalysis *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *source_subscripts,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *destination_subscripts)

{
  _Rb_tree_header *p_Var1;
  Loop *pLVar2;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *psVar3;
  ulong uVar4;
  SENode *pSVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *psVar9;
  long lVar10;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *this_00;
  iterator __first;
  pointer psVar11;
  ulong uVar12;
  long lVar13;
  _Rb_tree_header *__last;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *psVar14;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_recurrences;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrences;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  loops_in_pair;
  pointer local_c8;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_a8;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*> local_90;
  long local_80;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_78;
  pointer local_48;
  long local_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar13 = (long)(source_subscripts->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(source_subscripts->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 3;
    p_Var1 = &local_78._M_impl.super__Rb_tree_header;
    lVar10 = 0;
    do {
      local_90.first =
           (source_subscripts->
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar10];
      local_90.second =
           (destination_subscripts->
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar10];
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_78;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      std::
      _Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
      ::
      _M_insert_unique_<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>const&,std::_Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>::_Alloc_node>
                ((_Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                  *)&local_78,(const_iterator)p_Var1,&local_90,(_Alloc_node *)&local_a8);
      std::
      vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>
      ::
      emplace_back<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>
                ((vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>
                  *)__return_storage_ptr__,
                 (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)&local_78);
      std::
      _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
      ::_M_erase((_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)&local_78,(_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent
                );
      lVar10 = lVar10 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar10);
  }
  local_c8 = (this->loops_).
             super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->loops_).
             super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8 != local_48) {
    p_Var1 = &local_78._M_impl.super__Rb_tree_header;
    do {
      psVar11 = (__return_storage_ptr__->
                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->
          super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != psVar11) {
        pLVar2 = *local_c8;
        uVar12 = 0;
        uVar4 = 0xffffffffffffffff;
        do {
          local_40 = uVar12 * 0x30;
          __last = &psVar11[uVar12]._M_t._M_impl.super__Rb_tree_header;
          local_38 = psVar11;
          for (p_Var7 = psVar11[uVar12]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != __last;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            pSVar5 = ScalarEvolutionAnalysis::AnalyzeInstruction
                               (&this->scalar_evolution_,*(Instruction **)(p_Var7 + 1));
            SENode::CollectRecurrentNodes
                      ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        *)&local_90,pSVar5);
            pSVar5 = ScalarEvolutionAnalysis::AnalyzeInstruction
                               (&this->scalar_evolution_,(Instruction *)p_Var7[1]._M_parent);
            SENode::CollectRecurrentNodes(&local_a8,pSVar5);
            std::
            vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::SERecurrentNode**,std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>>>
                      ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                        *)&local_90,local_90.second,
                       local_a8.
                       super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_a8.
                       super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                          *)&local_78,this,
                         (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                          *)&local_90);
            for (p_Var6 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
                ((_Rb_tree_header *)p_Var6 != p_Var1 && (*(Loop **)(p_Var6 + 1) != pLVar2));
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            }
            std::
            _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
            ::_M_erase(&local_78,
                       (_Link_type)local_78._M_impl.super__Rb_tree_header._M_header._M_parent);
            if ((_Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                 *)local_a8.
                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                (_Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                 *)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.
                                    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_90.first != (Instruction *)0x0) {
              operator_delete(local_90.first,local_80 - (long)local_90.first);
            }
            if ((_Rb_tree_header *)p_Var6 != p_Var1) break;
          }
          uVar8 = uVar4;
          if (((_Rb_tree_header *)p_Var7 != __last) && (uVar8 = uVar12, uVar4 != 0xffffffffffffffff)
             ) {
            this_00 = (_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                       *)(&(local_38->_M_t)._M_impl.field_0x0 + local_40);
            std::
            _Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
            ::
            _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                      ((_Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                        *)((__return_storage_ptr__->
                           super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar4),
                       (this_00->_M_impl).super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                        )__last);
            std::
            _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            ::_M_erase(this_00,(_Link_type)
                               (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent);
            (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            (this_00->_M_impl).super__Rb_tree_header._M_header._M_left = &__last->_M_header;
            (this_00->_M_impl).super__Rb_tree_header._M_header._M_right = &__last->_M_header;
            (this_00->_M_impl).super__Rb_tree_header._M_node_count = 0;
            uVar8 = uVar4;
          }
          uVar12 = uVar12 + 1;
          psVar11 = (__return_storage_ptr__->
                    super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar4 = uVar8;
        } while (uVar12 < (ulong)(((long)(__return_storage_ptr__->
                                         super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)psVar11
                                  >> 4) * -0x5555555555555555));
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != local_48);
  }
  psVar14 = (__return_storage_ptr__->
            super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (__return_storage_ptr__->
           super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = ((long)psVar3 - (long)psVar14 >> 4) * -0x5555555555555555 >> 2;
  psVar9 = psVar14;
  if (0 < lVar13) {
    psVar9 = psVar14 + lVar13 * 4;
    lVar13 = lVar13 + 1;
    __first._M_current = psVar14 + 2;
    do {
      if (__first._M_current[-2]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        __first._M_current = __first._M_current + -2;
        goto LAB_005d6d70;
      }
      if (__first._M_current[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        __first._M_current = __first._M_current + -1;
        goto LAB_005d6d70;
      }
      if (((__first._M_current)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
      goto LAB_005d6d70;
      if (__first._M_current[1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        __first._M_current = __first._M_current + 1;
        goto LAB_005d6d70;
      }
      lVar13 = lVar13 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar13);
  }
  lVar13 = ((long)psVar3 - (long)psVar9 >> 4) * -0x5555555555555555;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      __first._M_current = psVar3;
      if ((lVar13 != 3) ||
         (__first._M_current = psVar9,
         (psVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) goto LAB_005d6d70;
      psVar9 = psVar9 + 1;
    }
    __first._M_current = psVar9;
    if ((psVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_005d6d70;
    psVar9 = psVar9 + 1;
  }
  __first._M_current = psVar9;
  if ((psVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __first._M_current = psVar3;
  }
LAB_005d6d70:
  psVar14 = __first._M_current + 1;
  if (psVar14 != psVar3 && __first._M_current != psVar3) {
    do {
      if ((psVar14->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::
        set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        ::operator=(__first._M_current,psVar14);
        __first._M_current = __first._M_current + 1;
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar3);
  }
  std::
  vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  ::_M_erase(__return_storage_ptr__,__first,
             (__return_storage_ptr__->
             super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

PartitionedSubscripts LoopDependenceAnalysis::PartitionSubscripts(
    const std::vector<Instruction*>& source_subscripts,
    const std::vector<Instruction*>& destination_subscripts) {
  PartitionedSubscripts partitions{};

  auto num_subscripts = source_subscripts.size();

  // Create initial partitions with one subscript pair per partition.
  for (size_t i = 0; i < num_subscripts; ++i) {
    partitions.push_back({{source_subscripts[i], destination_subscripts[i]}});
  }

  // Iterate over the loops to create all partitions
  for (auto loop : loops_) {
    int64_t k = -1;

    for (size_t j = 0; j < partitions.size(); ++j) {
      auto& current_partition = partitions[j];

      // Does |loop| appear in |current_partition|
      auto it = std::find_if(
          current_partition.begin(), current_partition.end(),
          [loop,
           this](const std::pair<Instruction*, Instruction*>& elem) -> bool {
            auto source_recurrences =
                scalar_evolution_.AnalyzeInstruction(std::get<0>(elem))
                    ->CollectRecurrentNodes();
            auto destination_recurrences =
                scalar_evolution_.AnalyzeInstruction(std::get<1>(elem))
                    ->CollectRecurrentNodes();

            source_recurrences.insert(source_recurrences.end(),
                                      destination_recurrences.begin(),
                                      destination_recurrences.end());

            auto loops_in_pair = CollectLoops(source_recurrences);
            auto end_it = loops_in_pair.end();

            return std::find(loops_in_pair.begin(), end_it, loop) != end_it;
          });

      auto has_loop = it != current_partition.end();

      if (has_loop) {
        if (k == -1) {
          k = j;
        } else {
          // Add |partitions[j]| to |partitions[k]| and discard |partitions[j]|
          partitions[static_cast<size_t>(k)].insert(current_partition.begin(),
                                                    current_partition.end());
          current_partition.clear();
        }
      }
    }
  }

  // Remove empty (discarded) partitions
  partitions.erase(
      std::remove_if(
          partitions.begin(), partitions.end(),
          [](const std::set<std::pair<Instruction*, Instruction*>>& partition) {
            return partition.empty();
          }),
      partitions.end());

  return partitions;
}